

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Normal3<float>
pbrt::Lerp<pbrt::Normal3,float>
          (Float t,Tuple3<pbrt::Normal3,_float> *t0,Tuple3<pbrt::Normal3,_float> *t1)

{
  undefined8 uVar1;
  Tuple3<pbrt::Normal3,_float> TVar2;
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Normal3<float> NVar7;
  Normal3<float> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Tuple3<pbrt::Normal3,_float> *in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffffa4;
  
  auVar6 = (undefined1  [56])0x0;
  NVar7 = operator*(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  auVar3._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  vmovlpd_avx(auVar3._0_16_);
  auVar6 = (undefined1  [56])0x0;
  NVar7 = operator*(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  auVar4._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  NVar7 = Tuple3<pbrt::Normal3,float>::operator+
                    ((Tuple3<pbrt::Normal3,_float> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  auVar5._0_8_ = NVar7.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  TVar2.z = NVar7.super_Tuple3<pbrt::Normal3,_float>.z;
  TVar2.x = (float)(int)uVar1;
  TVar2.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Normal3<float>)TVar2;
}

Assistant:

PBRT_CPU_GPU inline auto Lerp(Float t, const Tuple3<C, T> &t0, const Tuple3<C, T> &t1) {
    return (1 - t) * t0 + t * t1;
}